

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O2

int main(void)

{
  allocator local_16a;
  allocator local_169;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  string local_148;
  string local_128;
  Application app;
  
  webpp::Application::Application(&app,0x3039,4);
  std::__cxx11::string::string((string *)&local_128,"/",&local_169);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<std::shared_ptr<webpp::Response>_(webpp::Request_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Ariaszzzhc[P]webpp11/examples/hello.cc:9:22)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<std::shared_ptr<webpp::Response>_(webpp::Request_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Ariaszzzhc[P]webpp11/examples/hello.cc:9:22)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_148,"GET",&local_16a);
  webpp::Application::add_route
            (&app,&local_128,
             (function<std::shared_ptr<webpp::Response>_(webpp::Request_&)> *)&local_168,&local_148)
  ;
  std::__cxx11::string::~string((string *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  webpp::Application::run(&app);
  webpp::Application::~Application(&app);
  return 0;
}

Assistant:

int main() {
  Application app(12345, 4);

  app.add_route("/", [](Request& request) {
    auto response = make_shared<Response>("Hello, World!");

    return response;
  });

  app.run();

  return 0;
}